

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JoinVerticesProcess.cpp
# Opt level: O0

void __thiscall Assimp::JoinVerticesProcess::Execute(JoinVerticesProcess *this,aiScene *pScene)

{
  bool bVar1;
  int iVar2;
  Logger *pLVar3;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar4;
  basic_formatter *this_00;
  float local_1d0 [4];
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  string local_48;
  uint local_28;
  int local_24;
  uint a_1;
  int iNumVertices;
  uint a;
  int iNumOldVertices;
  aiScene *pScene_local;
  JoinVerticesProcess *this_local;
  
  _a = pScene;
  pScene_local = (aiScene *)this;
  pLVar3 = DefaultLogger::get();
  Logger::debug(pLVar3,"JoinVerticesProcess begin");
  iNumVertices = 0;
  bVar1 = DefaultLogger::isNullLogger();
  if (!bVar1) {
    for (a_1 = 0; a_1 < _a->mNumMeshes; a_1 = a_1 + 1) {
      iNumVertices = _a->mMeshes[a_1]->mNumVertices + iNumVertices;
    }
  }
  local_24 = 0;
  for (local_28 = 0; local_28 < _a->mNumMeshes; local_28 = local_28 + 1) {
    iVar2 = ProcessMesh(this,_a->mMeshes[local_28],local_28);
    local_24 = iVar2 + local_24;
  }
  bVar1 = DefaultLogger::isNullLogger();
  if (!bVar1) {
    if (iNumVertices == local_24) {
      pLVar3 = DefaultLogger::get();
      Logger::debug(pLVar3,"JoinVerticesProcess finished ");
    }
    else {
      pLVar3 = DefaultLogger::get();
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      basic_formatter<char[42]>
                (&local_1c0,(char (*) [42])"JoinVerticesProcess finished | Verts in: ");
      pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                         &local_1c0,&iNumVertices);
      pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_(pbVar4,(char (*) [7])" out: ");
      pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_(pbVar4,&local_24);
      pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
               Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
               operator_(pbVar4,(char (*) [5])" | ~");
      local_1d0[0] = ((float)(iNumVertices - local_24) / (float)iNumVertices) * 100.0;
      this_00 = (basic_formatter *)
                Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
                operator_(pbVar4,local_1d0);
      Formatter::basic_formatter::operator_cast_to_string(&local_48,this_00);
      Logger::info(pLVar3,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
      ~basic_formatter(&local_1c0);
    }
  }
  _a->mFlags = _a->mFlags | 8;
  return;
}

Assistant:

void JoinVerticesProcess::Execute( aiScene* pScene)
{
    ASSIMP_LOG_DEBUG("JoinVerticesProcess begin");

    // get the total number of vertices BEFORE the step is executed
    int iNumOldVertices = 0;
    if (!DefaultLogger::isNullLogger()) {
        for( unsigned int a = 0; a < pScene->mNumMeshes; a++)   {
            iNumOldVertices +=  pScene->mMeshes[a]->mNumVertices;
        }
    }

    // execute the step
    int iNumVertices = 0;
    for( unsigned int a = 0; a < pScene->mNumMeshes; a++)
        iNumVertices += ProcessMesh( pScene->mMeshes[a],a);

    // if logging is active, print detailed statistics
    if (!DefaultLogger::isNullLogger()) {
        if (iNumOldVertices == iNumVertices) {
            ASSIMP_LOG_DEBUG("JoinVerticesProcess finished ");
        } else {
            ASSIMP_LOG_INFO_F("JoinVerticesProcess finished | Verts in: ", iNumOldVertices,
                " out: ", iNumVertices, " | ~",
                ((iNumOldVertices - iNumVertices) / (float)iNumOldVertices) * 100.f );
        }
    }

    pScene->mFlags |= AI_SCENE_FLAGS_NON_VERBOSE_FORMAT;
}